

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

int __thiscall
CEditor::DoProperties(CEditor *this,CUIRect *pToolBox,CProperty *pProps,int *pIDs,int *pNewVal)

{
  CUI *this_00;
  vec3 *this_01;
  vec3 *v;
  byte bVar1;
  long lVar2;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint Checked;
  char *pText;
  CProperty *pCVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  vec3 vVar15;
  int local_13c;
  vec4 local_e8;
  CUIRect Down;
  CUIRect Up;
  CUIRect Yes;
  CUIRect Shifter;
  CUIRect Label;
  CUIRect Slot;
  CUIRect No;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_UI;
  this_01 = &this->m_InitialPickerColor;
  v = &this->m_SelectedPickerColor;
  local_13c = -1;
  lVar12 = 0;
  piVar9 = pIDs;
  do {
    if (pProps[lVar12].m_pName == (char *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return local_13c;
    }
    pCVar7 = pProps + lVar12;
    CUIRect::HSplitTop(pToolBox,13.0,&Slot,pToolBox);
    CUIRect::VSplitMid(&Slot,&Label,&Shifter,0.0);
    CUIRect::HMargin(&Shifter,1.0,&Shifter);
    CUI::DoLabel(this_00,&Label,pCVar7->m_pName,10.0,0,-1.0,true);
    if (pCVar7->m_Type - 1U < 7) {
      piVar8 = pIDs + lVar12;
      iVar10 = (int)lVar12;
      switch(pCVar7->m_Type) {
      case 1:
        CUIRect::VSplitMid(&Shifter,&No,&Yes,0.0);
        iVar5 = DoButton_ButtonDec(this,piVar8,"No",(uint)(pCVar7->m_Value == 0),&No,0,"");
        if (iVar5 != 0) {
          *pNewVal = 0;
          local_13c = iVar10;
        }
        iVar5 = DoButton_ButtonInc(this,(void *)((long)piVar8 + 1),"Yes",pCVar7->m_Value,&Yes,0,"");
        if (iVar5 != 0) {
          *pNewVal = 1;
          local_13c = iVar10;
        }
        break;
      case 2:
        CUIRect::VSplitRight(&Shifter,10.0,&Shifter,&Yes);
        CUIRect::VSplitLeft(&Shifter,10.0,&Up,&Shifter);
        str_format((char *)&No,0x40,"%d",(ulong)(uint)pCVar7->m_Value);
        Down.x = 1.0;
        Down.y = 1.0;
        Down.w = 1.0;
        Down.h = 0.5;
        CUIRect::Draw(&Shifter,(vec4 *)&Down,0.0,0);
        CUI::DoLabel(this_00,&Shifter,(char *)&No,10.0,1,-1.0,true);
        iVar5 = DoButton_ButtonDec(this,piVar8,(char *)0x0,0,&Up,0,"Decrease");
        if (iVar5 != 0) {
          *pNewVal = pCVar7->m_Value + -1;
          local_13c = iVar10;
        }
        iVar5 = DoButton_ButtonInc(this,(void *)((long)piVar8 + 1),(char *)0x0,0,&Yes,0,"Increase");
        if (iVar5 != 0) {
          iVar5 = pCVar7->m_Value + 1;
LAB_0018b43d:
          *pNewVal = iVar5;
          local_13c = iVar10;
        }
        break;
      case 3:
        iVar5 = UiDoValueSelector(this,piVar8,&Shifter,"",pCVar7->m_Value,pCVar7->m_Min,
                                  pCVar7->m_Max,1,1.0,
                                  "Use left mouse button to drag and change the value. Hold shift to be more precise."
                                 );
        if (iVar5 != pCVar7->m_Value) goto LAB_0018b43d;
        break;
      case 4:
        CUIRect::HSplitTop(pToolBox,39.0,&Slot,pToolBox);
        CUIRect::VSplitMid(&Slot,&No,&Yes,0.0);
        CUIRect::HMargin(&No,1.0,&No);
        CUIRect::VMargin(&No,6.0,&No);
        uVar11 = 0;
        piVar8 = piVar9;
        for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 4) {
          bVar1 = *(byte *)((long)DoProperties::s_aShift + lVar13);
          iVar5 = UiDoValueSelector(this,piVar8,&Shifter,
                                    (char *)((long)&
                                                  _ZZN7CEditor12DoPropertiesEP7CUIRectP9CPropertyPiS4_E9s_paTexts_rel
                                            + (long)*(int *)((long)&
                                                  _ZZN7CEditor12DoPropertiesEP7CUIRectP9CPropertyPiS4_E9s_paTexts_rel
                                                  + lVar13)),
                                    pCVar7->m_Value >> (bVar1 & 0x1f) & 0xff,0,0xff,1,1.0,
                                    "Use left mouse button to drag and change the color value. Hold shift to be more precise."
                                   );
          if (lVar13 != 0xc) {
            CUIRect::HSplitTop(&Yes,13.0,&Shifter,&Yes);
            CUIRect::HMargin(&Shifter,1.0,&Shifter);
          }
          uVar11 = uVar11 | iVar5 << (bVar1 & 0x1f);
          piVar8 = (int *)((long)piVar8 + 1);
        }
        uVar6 = pCVar7->m_Value;
        Checked = uVar6 >> 0x18;
        Up.w = (float)(uVar6 >> 8 & 0xff) / 255.0;
        auVar14._0_4_ = (float)Checked;
        auVar14._4_4_ = (float)(uVar6 >> 0x10 & 0xff);
        auVar14._8_8_ = 0;
        auVar14 = divps(auVar14,_DAT_001c9f70);
        Up._0_8_ = auVar14._0_8_;
        Up.h = 1.0;
        CUIRect::Draw(&No,(vec4 *)&Up,0.0,0);
        iVar5 = DoButton_Editor_Common
                          (this,&DoProperties::s_ColorPicker,pText,Checked,&No,0,(char *)0x0);
        if (iVar5 != 0) {
          vVar15.field_2.z = Up.w;
          vVar15.field_0.x = Up.x;
          vVar15.field_1.y = Up.y;
          vVar15 = RgbToHsv(vVar15);
          (this->m_InitialPickerColor).field_0 =
               (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(int)vVar15._0_8_;
          (this->m_InitialPickerColor).field_1 =
               (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)(int)((ulong)vVar15._0_8_ >> 0x20)
          ;
          (this->m_InitialPickerColor).field_2 = vVar15.field_2;
          aVar3 = this_01->field_1;
          v->field_0 = this_01->field_0;
          v->field_1 = aVar3;
          (this->m_SelectedPickerColor).field_2 = (this->m_InitialPickerColor).field_2;
          CUI::DoPopupMenu(this_00,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0xb4,0xb4,
                           this,PopupColorPicker,0xf);
        }
        bVar4 = vector3_base<float>::operator!=(this_01,v);
        if (bVar4) {
          (this->m_InitialPickerColor).field_2 = (this->m_SelectedPickerColor).field_2;
          aVar3 = v->field_1;
          this_01->field_0 = v->field_0;
          this_01->field_1 = aVar3;
          vVar15 = HsvToRgb(this->m_SelectedPickerColor);
          uVar6 = pCVar7->m_Value;
          uVar11 = uVar6 & 0xff |
                   ((int)(vVar15.field_2.z * 255.0) & 0xffU) << 8 |
                   ((int)(vVar15.field_1.y * 255.0) & 0xffU) << 0x10 |
                   (int)(vVar15.field_0.x * 255.0) << 0x18;
        }
        else {
          uVar6 = pCVar7->m_Value;
        }
        if (uVar11 != uVar6) {
          *pNewVal = uVar11;
          local_13c = iVar10;
        }
        break;
      case 5:
        if (pCVar7->m_Value < 0) {
          str_copy((char *)&No,"None",0x40);
        }
        else {
          str_format((char *)&No,0x40,"%s");
        }
        iVar5 = DoButton_Editor(this,piVar8,(char *)&No,0,&Shifter,0,(char *)0x0);
        if (iVar5 != 0) {
          PopupSelectImageInvoke(this,pCVar7->m_Value,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
        }
        iVar5 = PopupSelectImageResult(this);
        if (-2 < iVar5) goto LAB_0018b43d;
        break;
      case 7:
        CUIRect::VSplitMid(&Shifter,&No,&Up,2.0);
        CUIRect::VSplitLeft(&No,10.0,&No,&Shifter);
        CUIRect::VSplitRight(&Shifter,10.0,&Shifter,&Yes);
        Down.x = 1.0;
        Down.y = 1.0;
        Down.w = 1.0;
        Down.h = 0.5;
        CUIRect::Draw(&Shifter,(vec4 *)&Down,0.0,0);
        CUI::DoLabel(this_00,&Shifter,"X",10.0,1,-1.0,true);
        CUIRect::VSplitLeft(&Up,10.0,&Up,&Shifter);
        CUIRect::VSplitRight(&Shifter,10.0,&Shifter,&Down);
        local_e8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
        local_e8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
        local_e8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
        local_e8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
        CUIRect::Draw(&Shifter,&local_e8,0.0,0);
        CUI::DoLabel(this_00,&Shifter,"Y",10.0,1,-1.0,true);
        iVar5 = DoButton_ButtonDec(this,piVar8,"-",0,&No,0,"Left");
        if (iVar5 != 0) {
          *pNewVal = 1;
          local_13c = iVar10;
        }
        iVar5 = DoButton_ButtonInc(this,(void *)((long)piVar8 + 3),"+",0,&Yes,0,"Right");
        if (iVar5 != 0) {
          *pNewVal = 2;
          local_13c = iVar10;
        }
        iVar5 = DoButton_ButtonDec(this,(void *)((long)piVar8 + 1),"-",0,&Up,0,"Up");
        if (iVar5 != 0) {
          *pNewVal = 4;
          local_13c = iVar10;
        }
        iVar5 = DoButton_ButtonInc(this,(void *)((long)piVar8 + 2),"+",0,&Down,0,"Down");
        if (iVar5 != 0) {
          *pNewVal = 8;
          local_13c = iVar10;
        }
      }
    }
    lVar12 = lVar12 + 1;
    piVar9 = piVar9 + 1;
  } while( true );
}

Assistant:

int CEditor::DoProperties(CUIRect *pToolBox, CProperty *pProps, int *pIDs, int *pNewVal)
{
	int Change = -1;

	for(int i = 0; pProps[i].m_pName; i++)
	{
		CUIRect Slot;
		pToolBox->HSplitTop(13.0f, &Slot, pToolBox);
		CUIRect Label, Shifter;
		Slot.VSplitMid(&Label, &Shifter);
		Shifter.HMargin(1.0f, &Shifter);
		UI()->DoLabel(&Label, pProps[i].m_pName, 10.0f, TEXTALIGN_LEFT);

		if(pProps[i].m_Type == PROPTYPE_INT_STEP)
		{
			CUIRect Inc, Dec;
			char aBuf[64];

			Shifter.VSplitRight(10.0f, &Shifter, &Inc);
			Shifter.VSplitLeft(10.0f, &Dec, &Shifter);
			str_format(aBuf, sizeof(aBuf),"%d", pProps[i].m_Value);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, aBuf, 10.0f,TEXTALIGN_CENTER);

			if(DoButton_ButtonDec(&pIDs[i], 0, 0, &Dec, 0, "Decrease"))
			{
				*pNewVal = pProps[i].m_Value-1;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+1, 0, 0, &Inc, 0, "Increase"))
			{
				*pNewVal = pProps[i].m_Value+1;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_BOOL)
		{
			CUIRect No, Yes;
			Shifter.VSplitMid(&No, &Yes);
			if(DoButton_ButtonDec(&pIDs[i], "No", !pProps[i].m_Value, &No, 0, ""))
			{
				*pNewVal = 0;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+1, "Yes", pProps[i].m_Value, &Yes, 0, ""))
			{
				*pNewVal = 1;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_INT_SCROLL)
		{
			int NewValue = UiDoValueSelector(&pIDs[i], &Shifter, "", pProps[i].m_Value, pProps[i].m_Min, pProps[i].m_Max, 1, 1.0f, "Use left mouse button to drag and change the value. Hold shift to be more precise.");
			if(NewValue != pProps[i].m_Value)
			{
				*pNewVal = NewValue;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_COLOR)
		{
			static const char *s_paTexts[4] = {"R", "G", "B", "A"};
			static int s_aShift[] = {24, 16, 8, 0};
			int NewColor = 0;

			// extra space
			CUIRect ColorBox, ColorSlots;

			pToolBox->HSplitTop(3.0f*13.0f, &Slot, pToolBox);
			Slot.VSplitMid(&ColorBox, &ColorSlots);
			ColorBox.HMargin(1.0f, &ColorBox);
			ColorBox.VMargin(6.0f, &ColorBox);

			for(int c = 0; c < 4; c++)
			{
				int v = (pProps[i].m_Value >> s_aShift[c])&0xff;
				NewColor |= UiDoValueSelector(((char *)&pIDs[i])+c, &Shifter, s_paTexts[c], v, 0, 255, 1, 1.0f, "Use left mouse button to drag and change the color value. Hold shift to be more precise.")<<s_aShift[c];

				if(c != 3)
				{
					ColorSlots.HSplitTop(13.0f, &Shifter, &ColorSlots);
					Shifter.HMargin(1.0f, &Shifter);
				}
			}

			// color picker
			vec4 Color = vec4(
				((pProps[i].m_Value >> s_aShift[0])&0xff)/255.0f,
				((pProps[i].m_Value >> s_aShift[1])&0xff)/255.0f,
				((pProps[i].m_Value >> s_aShift[2])&0xff)/255.0f,
				1.0f);

			ColorBox.Draw(Color, 0.0f, CUIRect::CORNER_NONE);
			static int s_ColorPicker;
			if(DoButton_Editor_Common(&s_ColorPicker, 0x0, 0, &ColorBox, 0, 0x0))
			{
				m_InitialPickerColor = RgbToHsv(vec3(Color.r, Color.g, Color.b));
				m_SelectedPickerColor = m_InitialPickerColor;
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 180, 180, this, PopupColorPicker);
			}

			if(m_InitialPickerColor != m_SelectedPickerColor)
			{
				m_InitialPickerColor = m_SelectedPickerColor;
				vec3 c = HsvToRgb(m_SelectedPickerColor);
				NewColor = ((int)(c.r * 255.0f)&0xff) << 24 | ((int)(c.g * 255.0f)&0xff) << 16 | ((int)(c.b * 255.0f)&0xff) << 8 | (pProps[i].m_Value&0xff);
			}

			if(NewColor != pProps[i].m_Value)
			{
				*pNewVal = NewColor;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_IMAGE)
		{
			char aBuf[64];
			if(pProps[i].m_Value < 0)
				str_copy(aBuf, "None", sizeof(aBuf));
			else
				str_format(aBuf, sizeof(aBuf),"%s", m_Map.m_lImages[pProps[i].m_Value]->m_aName);

			if(DoButton_Editor(&pIDs[i], aBuf, 0, &Shifter, 0, 0))
				PopupSelectImageInvoke(pProps[i].m_Value, UI()->MouseX(), UI()->MouseY());

			int r = PopupSelectImageResult();
			if(r >= -1)
			{
				*pNewVal = r;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_SHIFT)
		{
			CUIRect Left, Right, Up, Down;
			Shifter.VSplitMid(&Left, &Up, 2.0f);
			Left.VSplitLeft(10.0f, &Left, &Shifter);
			Shifter.VSplitRight(10.0f, &Shifter, &Right);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, "X", 10.0f, TEXTALIGN_CENTER);
			Up.VSplitLeft(10.0f, &Up, &Shifter);
			Shifter.VSplitRight(10.0f, &Shifter, &Down);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, "Y", 10.0f, TEXTALIGN_CENTER);
			if(DoButton_ButtonDec(&pIDs[i], "-", 0, &Left, 0, "Left"))
			{
				*pNewVal = 1;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+3, "+", 0, &Right, 0, "Right"))
			{
				*pNewVal = 2;
				Change = i;
			}
			if(DoButton_ButtonDec(((char *)&pIDs[i])+1, "-", 0, &Up, 0, "Up"))
			{
				*pNewVal = 4;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+2, "+", 0, &Down, 0, "Down"))
			{
				*pNewVal = 8;
				Change = i;
			}
		}
	}

	return Change;
}